

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O2

int __thiscall GrcFont::ScanGlyfIds(GrcFont *this)

{
  bool bVar1;
  utf16 uVar2;
  int ig;
  void *pvVar3;
  long lVar4;
  GdlObject *in_RDX;
  GdlObject *extraout_RDX;
  GdlObject *extraout_RDX_00;
  GdlObject *extraout_RDX_01;
  GdlObject *extraout_RDX_02;
  GdlObject *pGVar5;
  GdlObject *extraout_RDX_03;
  ulong uVar6;
  uint uVar7;
  uint nUni;
  iterator fit;
  uint local_48;
  uint local_44;
  iterator local_40;
  
  if (this->m_nMaxGlyfId == -1) {
    this->m_cnUnicode = 0;
    bVar1 = false;
    for (local_48 = 0; local_48 < 0x10fffe; local_48 = local_48 + 1) {
      if ((local_48 & 0x1ffffe) == 0xfffe) {
LAB_00148a52:
        if (bVar1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&this->m_vnLimUnicode,&local_48);
          bVar1 = false;
          in_RDX = extraout_RDX_01;
        }
      }
      else {
        uVar2 = GlyphFromCmap(this,local_48,in_RDX);
        in_RDX = extraout_RDX;
        if (uVar2 == 0) goto LAB_00148a52;
        if (!bVar1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&this->m_vnMinUnicode,&local_48);
          bVar1 = true;
          in_RDX = extraout_RDX_00;
        }
        this->m_cnUnicode = this->m_cnUnicode + 1;
      }
    }
    if (bVar1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_vnLimUnicode,&local_48);
    }
    pvVar3 = operator_new__(0x40000);
    for (lVar4 = 0; lVar4 != 0xffff; lVar4 = lVar4 + 1) {
      *(undefined4 *)((long)pvVar3 + lVar4 * 4) = 0;
    }
    this->m_nMaxGlyfId = 0;
    uVar6 = (ulong)*(this->m_vnMinUnicode).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
    pGVar5 = extraout_RDX_02;
    local_40.m_pfont = this;
    local_40._8_8_ = uVar6;
    while (uVar7 = (uint)uVar6, uVar7 != 0xffffffff) {
      local_48 = uVar7;
      uVar2 = GlyphFromCmap(this,uVar7,pGVar5);
      if (uVar2 != 0) {
        uVar6 = (ulong)uVar2;
        uVar7 = this->m_nMaxGlyfId;
        if ((int)uVar7 <= (int)(uint)uVar2) {
          uVar7 = (uint)uVar2;
        }
        this->m_nMaxGlyfId = uVar7;
        uVar7 = *(uint *)((long)pvVar3 + uVar6 * 4);
        if (uVar7 != 0xffff) {
          if (uVar7 == 0) {
            *(uint *)((long)pvVar3 + uVar6 * 4) = local_48;
            goto LAB_00148b29;
          }
          local_44 = uVar7;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&this->m_vnCollisions,&local_44);
          *(undefined4 *)((long)pvVar3 + uVar6 * 4) = 0xffff;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->m_vnCollisions,&local_48);
      }
LAB_00148b29:
      iterator::operator++(&local_40);
      pGVar5 = extraout_RDX_03;
      uVar6 = local_40._8_8_ & 0xffffffff;
    }
    operator_delete__(pvVar3);
  }
  return 1;
}

Assistant:

int GrcFont::ScanGlyfIds(void)
{
	Assert(m_pCmap_3_10 || m_pCmap_3_1);
	if (m_nMaxGlyfId != -1) // return if called more than once
		return true;

	// determine ranges of Unicode codepoints supported by this font
	// TODO: is there a more efficient way to do this?

	unsigned int nUni;
	bool fInUsedRange = false;
	m_cnUnicode = 0;
	for (nUni = 0; nUni <= 0x0010FFFD; nUni++)
	{
		utf16 gid;
		if (nUni == 0x0000FFFE || nUni == 0x0000FFFF) // invalid
			gid = 0;
		else
			gid = GlyphFromCmap(nUni, NULL);

        if (gid != 0 && !fInUsedRange)
		{
			// Record the beginning of the range
			m_vnMinUnicode.push_back(nUni);
			fInUsedRange = true;
		}
		else if (gid == 0 && fInUsedRange)
		{
			// Record the end of the range.
			m_vnLimUnicode.push_back(nUni);
			fInUsedRange = false;
		}
		if (gid != 0)
			m_cnUnicode++;
	}
	if (fInUsedRange)
		m_vnLimUnicode.push_back(nUni);
	Assert(m_vnLimUnicode.size() == m_vnMinUnicode.size());

	// create array indexed by glyf id containing unicode codepoints
	unsigned int *prgnUsed = new unsigned int[0x10000];
	if (!prgnUsed)
	{
		g_errorList.AddError(129, NULL,
			"Memory failure: could not allocate prgUsed array when scanning glyph ids");
		return false;
	}
	// initialize all elements to zero
	for (int ig = 0; ig < 0xFFFF; ig++)
		prgnUsed[ig] = 0;
	m_nMaxGlyfId = 0;

	// get glyf id for all unicode codepoints and look for collisions
	GrcFont::iterator fit;
	GrcFont::iterator fitEnd = this->End();
	for (fit = this->Begin(); fit != fitEnd; ++fit)
	{
		nUni = *fit;
		Assert(nUni != 0x0000FFFE);  // invalid
		Assert(nUni != 0x0000FFFF);  // invalid
		Assert(nUni != 0x0010FFFE);  // invalid
		Assert(nUni != 0x0010FFFF);  // invalid

		utf16 gid = GlyphFromCmap(nUni, NULL); // find glyf id
		if (gid == 0) // 0 - normally is default glyf id
		{
			Assert(false); // iterators only cover codepoints with valid glyph IDs
			continue;
		}
		m_nMaxGlyfId = max(m_nMaxGlyfId, static_cast<int>(gid)); // track largest glyf id
		if (!prgnUsed[gid]) // if this glyf id not seen yet
		{
			prgnUsed[gid] = nUni; // store current unicode id
		}
		else
		{
			// track Unicode ids that collide
			int nPrevUni = prgnUsed[gid];
			if (nPrevUni != 0x0000FFFF) 
			{
				// first collision - need to store both Unicode ids in array and current id
				m_vnCollisions.push_back(nPrevUni);
				// indicate one collision occurred, don't want to store array id if another
				// collision occurs; 0xFFFF is an illegal unicode value
				prgnUsed[gid] = 0x0000FFFF; 
			}
			m_vnCollisions.push_back(nUni); // store current unicode id always
		}
	}
	delete [] prgnUsed;
	return true;
}